

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O0

void uavs3d_ipred_ang_y_32_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 (*pauVar24) [16];
  undefined1 (*pauVar25) [16];
  undefined8 *puVar26;
  long lVar27;
  int in_EDX;
  long lVar28;
  undefined8 *in_RSI;
  long lVar29;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i H2;
  __m128i H1;
  __m128i H0;
  __m128i S1_1;
  __m128i S0_1;
  __m128i S2_1;
  __m128i p11;
  __m128i p10;
  __m128i zero_1;
  __m128i coeff2_1;
  __m128i d1;
  __m128i d0;
  __m128i m0;
  __m256i L2;
  __m256i L1;
  __m256i L0;
  __m256i S2;
  __m256i S1;
  __m256i S0;
  __m256i p1;
  __m256i p0;
  int i_dst2;
  __m128i shuffle2;
  __m128i shuffle1;
  __m256i zero;
  __m256i coeff2;
  pel *pfirst [2];
  int aligned_line_size;
  __m128i pad_val;
  int i;
  int real_size;
  int line_size;
  pel first_line [256];
  int local_ab4;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined1 auStack_8f0 [16];
  int local_82c;
  byte local_820 [8];
  undefined8 auStack_818 [32];
  int local_718;
  int local_714;
  int local_70c;
  undefined8 *local_708;
  undefined1 (*local_700) [16];
  undefined1 (*local_6f8) [16];
  undefined1 (*local_6f0) [16];
  undefined1 (*local_6e8) [16];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 *local_6b0;
  byte local_6a1;
  undefined1 local_6a0 [16];
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined2 local_602;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [16];
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 *local_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 *local_570;
  undefined2 local_562;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [32];
  undefined8 local_440;
  ulong uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  ulong uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  ulong uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined4 local_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  ulong uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  ulong uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  ulong uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined4 local_2d4;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  ulong local_2a0;
  undefined8 local_298;
  ulong local_290;
  undefined8 local_288;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  ulong local_260;
  undefined8 local_258;
  ulong local_250;
  undefined8 local_248;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  ulong local_220;
  undefined8 local_218;
  ulong local_210;
  undefined8 local_208;
  undefined1 local_200;
  undefined1 local_1ff;
  undefined1 local_1fe;
  undefined1 local_1fd;
  undefined1 local_1fc;
  undefined1 local_1fb;
  undefined1 local_1fa;
  undefined1 local_1f9;
  undefined1 local_1f8;
  undefined1 local_1f7;
  undefined1 local_1f6;
  undefined1 local_1f5;
  undefined1 local_1f4;
  undefined1 local_1f3;
  undefined1 local_1f2;
  undefined1 local_1f1;
  undefined1 local_1f0;
  undefined1 local_1ef;
  undefined1 local_1ee;
  undefined1 local_1ed;
  undefined1 local_1ec;
  undefined1 local_1eb;
  undefined1 local_1ea;
  undefined1 local_1e9;
  undefined1 local_1e8;
  undefined1 local_1e7;
  undefined1 local_1e6;
  undefined1 local_1e5;
  undefined1 local_1e4;
  undefined1 local_1e3;
  undefined1 local_1e2;
  undefined1 local_1e1;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined1 local_120 [16];
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined1 local_108;
  undefined1 local_107;
  undefined1 local_106;
  undefined1 local_105;
  undefined1 local_104;
  undefined1 local_103;
  undefined1 local_102;
  undefined1 local_101;
  undefined1 local_100 [16];
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined1 local_e8;
  undefined1 local_e7;
  undefined1 local_e6;
  undefined1 local_e5;
  undefined1 local_e4;
  undefined1 local_e3;
  undefined1 local_e2;
  undefined1 local_e1;
  undefined1 local_e0 [16];
  byte local_d0;
  byte local_cf;
  byte local_ce;
  byte local_cd;
  byte local_cc;
  byte local_cb;
  byte local_ca;
  byte local_c9;
  byte local_c8;
  byte local_c7;
  byte local_c6;
  byte local_c5;
  byte local_c4;
  byte local_c3;
  byte local_c2;
  byte local_c1;
  undefined1 local_c0 [16];
  undefined2 local_b0;
  undefined2 local_ae;
  undefined2 local_ac;
  undefined2 local_aa;
  undefined2 local_a8;
  undefined2 local_a6;
  undefined2 local_a4;
  undefined2 local_a2;
  undefined1 local_a0 [16];
  undefined1 auStack_90 [16];
  undefined2 local_78;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  undefined2 local_68;
  undefined2 local_66;
  undefined2 local_64;
  undefined2 local_62;
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  
  iVar21 = in_R9D / 2 + in_R8D;
  iVar22 = iVar21 + -1;
  local_ab4 = in_R9D;
  if (iVar22 < in_R9D) {
    local_ab4 = iVar22;
  }
  local_562 = 2;
  local_5a = 2;
  local_5c = 2;
  local_5e = 2;
  local_60 = 2;
  local_62 = 2;
  local_64 = 2;
  local_66 = 2;
  local_68 = 2;
  local_6a = 2;
  local_6c = 2;
  local_6e = 2;
  local_70 = 2;
  local_72 = 2;
  local_74 = 2;
  local_76 = 2;
  local_78 = 2;
  auVar2 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar2 = vpinsrw_avx(auVar2,2,2);
  auVar2 = vpinsrw_avx(auVar2,2,3);
  auVar2 = vpinsrw_avx(auVar2,2,4);
  auVar2 = vpinsrw_avx(auVar2,2,5);
  auVar2 = vpinsrw_avx(auVar2,2,6);
  auVar3 = vpinsrw_avx(auVar2,2,7);
  auVar2 = vpinsrw_avx(ZEXT216(2),2,1);
  auVar2 = vpinsrw_avx(auVar2,2,2);
  auVar2 = vpinsrw_avx(auVar2,2,3);
  auVar2 = vpinsrw_avx(auVar2,2,4);
  auVar2 = vpinsrw_avx(auVar2,2,5);
  auVar2 = vpinsrw_avx(auVar2,2,6);
  auStack_90 = vpinsrw_avx(auVar2,2,7);
  local_a0._0_8_ = auVar3._0_8_;
  uVar8 = local_a0._0_8_;
  local_a0._8_8_ = auVar3._8_8_;
  uVar9 = local_a0._8_8_;
  uVar10 = auStack_90._0_8_;
  uVar11 = auStack_90._8_8_;
  local_460._8_8_ = SUB328(ZEXT832(0),4);
  uVar7 = local_460._8_8_;
  local_1e1 = 0xf;
  local_1e2 = 0xd;
  local_1e3 = 0xb;
  local_1e4 = 9;
  local_1e5 = 7;
  local_1e6 = 5;
  local_1e7 = 3;
  local_1e8 = 1;
  local_1e9 = 0xe;
  local_1ea = 0xc;
  local_1eb = 10;
  local_1ec = 8;
  local_1ed = 6;
  local_1ee = 4;
  local_1ef = 2;
  local_1f0 = 0;
  local_101 = 0;
  local_102 = 2;
  local_103 = 4;
  local_104 = 6;
  local_105 = 8;
  local_106 = 10;
  local_107 = 0xc;
  local_108 = 0xe;
  local_109 = 1;
  local_10a = 3;
  local_10b = 5;
  local_10c = 7;
  local_10d = 9;
  local_10e = 0xb;
  local_10f = 0xd;
  local_110 = 0xf;
  auVar2 = vpinsrb_avx(ZEXT116(0xf),0xd,1);
  auVar2 = vpinsrb_avx(auVar2,0xb,2);
  auVar2 = vpinsrb_avx(auVar2,9,3);
  auVar2 = vpinsrb_avx(auVar2,7,4);
  auVar2 = vpinsrb_avx(auVar2,5,5);
  auVar2 = vpinsrb_avx(auVar2,3,6);
  auVar2 = vpinsrb_avx(auVar2,1,7);
  auVar2 = vpinsrb_avx(auVar2,0xe,8);
  auVar2 = vpinsrb_avx(auVar2,0xc,9);
  auVar2 = vpinsrb_avx(auVar2,10,10);
  auVar2 = vpinsrb_avx(auVar2,8,0xb);
  auVar2 = vpinsrb_avx(auVar2,6,0xc);
  auVar2 = vpinsrb_avx(auVar2,4,0xd);
  auVar2 = vpinsrb_avx(auVar2,2,0xe);
  auVar2 = vpinsrb_avx(auVar2,0,0xf);
  local_120._0_8_ = auVar2._0_8_;
  uVar17 = local_120._0_8_;
  local_120._8_8_ = auVar2._8_8_;
  uVar18 = local_120._8_8_;
  local_1f1 = 0xe;
  local_1f2 = 0xc;
  local_1f3 = 10;
  local_1f4 = 8;
  local_1f5 = 6;
  local_1f6 = 4;
  local_1f7 = 2;
  local_1f8 = 0;
  local_1f9 = 0xf;
  local_1fa = 0xd;
  local_1fb = 0xb;
  local_1fc = 9;
  local_1fd = 7;
  local_1fe = 5;
  local_1ff = 3;
  local_200 = 1;
  local_e1 = 1;
  local_e2 = 3;
  local_e3 = 5;
  local_e4 = 7;
  local_e5 = 9;
  local_e6 = 0xb;
  local_e7 = 0xd;
  local_e8 = 0xf;
  local_e9 = 0;
  local_ea = 2;
  local_eb = 4;
  local_ec = 6;
  local_ed = 8;
  local_ee = 10;
  local_ef = 0xc;
  local_f0 = 0xe;
  auVar1 = vpinsrb_avx(ZEXT116(0xe),0xc,1);
  auVar1 = vpinsrb_avx(auVar1,10,2);
  auVar1 = vpinsrb_avx(auVar1,8,3);
  auVar1 = vpinsrb_avx(auVar1,6,4);
  auVar1 = vpinsrb_avx(auVar1,4,5);
  auVar1 = vpinsrb_avx(auVar1,2,6);
  auVar1 = vpinsrb_avx(auVar1,0,7);
  auVar1 = vpinsrb_avx(auVar1,0xf,8);
  auVar1 = vpinsrb_avx(auVar1,0xd,9);
  auVar1 = vpinsrb_avx(auVar1,0xb,10);
  auVar1 = vpinsrb_avx(auVar1,9,0xb);
  auVar1 = vpinsrb_avx(auVar1,7,0xc);
  auVar1 = vpinsrb_avx(auVar1,5,0xd);
  auVar1 = vpinsrb_avx(auVar1,3,0xe);
  auVar1 = vpinsrb_avx(auVar1,1,0xf);
  local_100._0_8_ = auVar1._0_8_;
  uVar19 = local_100._0_8_;
  local_100._8_8_ = auVar1._8_8_;
  uVar20 = local_100._8_8_;
  iVar23 = in_EDX << 1;
  lVar27 = (long)(int)(iVar21 + 0x3eU & 0xfffffff0);
  lVar16 = lVar27 + -0x820;
  local_700 = (undefined1 (*) [16])(in_RDI + -0x12);
  local_718 = in_R9D;
  local_714 = in_R8D;
  local_70c = in_EDX;
  local_708 = in_RSI;
  local_460 = ZEXT832(0) << 0x20;
  local_120 = auVar2;
  local_100 = auVar1;
  local_a0 = auVar3;
  for (local_82c = 0; local_82c < local_ab4 + -4; local_82c = local_82c + 8) {
    local_220 = *(ulong *)(local_700[-1] + 0xf);
    local_210 = *(ulong *)(*local_700 + 7);
    local_208 = 0;
    local_218 = 0;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = local_220;
    local_240 = vpunpcklqdq_avx(auVar30,ZEXT816(0));
    auVar33._8_8_ = 0;
    auVar33._0_8_ = local_210;
    auStack_230 = vpunpcklqdq_avx(auVar33,ZEXT816(0));
    local_260 = *(ulong *)*local_700;
    local_250 = *(ulong *)(*local_700 + 8);
    local_248 = 0;
    local_258 = 0;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = local_260;
    local_280 = vpunpcklqdq_avx(auVar31,ZEXT816(0));
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_250;
    auStack_270 = vpunpcklqdq_avx(auVar34,ZEXT816(0));
    local_2a0 = *(ulong *)(*local_700 + 1);
    local_290 = *(ulong *)(*local_700 + 9);
    local_288 = 0;
    local_298 = 0;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_2a0;
    local_2c0 = vpunpcklqdq_avx(auVar32,ZEXT816(0));
    auVar35._8_8_ = 0;
    auVar35._0_8_ = local_290;
    auStack_2b0 = vpunpcklqdq_avx(auVar35,ZEXT816(0));
    local_3a0 = local_240._0_8_;
    uStack_398 = local_240._8_8_;
    uStack_390 = auStack_230._0_8_;
    uStack_388 = auStack_230._8_8_;
    local_3c0 = 0;
    uStack_3b8 = uVar7;
    uStack_3b0 = 0;
    uStack_3a8 = 0;
    auVar4._16_8_ = auStack_230._0_8_;
    auVar4._0_16_ = local_240;
    auVar4._24_8_ = auStack_230._8_8_;
    auVar4 = vpunpcklbw_avx2(auVar4,ZEXT832((ulong)uVar7) << 0x40);
    local_3e0 = local_280._0_8_;
    uStack_3d8 = local_280._8_8_;
    uStack_3d0 = auStack_270._0_8_;
    uStack_3c8 = auStack_270._8_8_;
    local_400 = 0;
    uStack_3f8 = uVar7;
    uStack_3f0 = 0;
    uStack_3e8 = 0;
    auVar5._16_8_ = auStack_270._0_8_;
    auVar5._0_16_ = local_280;
    auVar5._24_8_ = auStack_270._8_8_;
    auVar5 = vpunpcklbw_avx2(auVar5,ZEXT832((ulong)uVar7) << 0x40);
    local_420 = local_2c0._0_8_;
    uStack_418 = local_2c0._8_8_;
    uStack_410 = auStack_2b0._0_8_;
    uStack_408 = auStack_2b0._8_8_;
    local_440 = 0;
    uStack_438 = uVar7;
    uStack_430 = 0;
    uStack_428 = 0;
    auVar13._16_8_ = auStack_2b0._0_8_;
    auVar13._0_16_ = local_2c0;
    auVar13._24_8_ = auStack_2b0._8_8_;
    auVar6 = vpunpcklbw_avx2(auVar13,ZEXT832((ulong)uVar7) << 0x40);
    local_9a0 = auVar4._0_8_;
    uStack_998 = auVar4._8_8_;
    uStack_990 = auVar4._16_8_;
    uStack_988 = auVar4._24_8_;
    local_9c0 = auVar5._0_8_;
    uStack_9b8 = auVar5._8_8_;
    uStack_9b0 = auVar5._16_8_;
    uStack_9a8 = auVar5._24_8_;
    local_480 = local_9a0;
    uStack_478 = uStack_998;
    uStack_470 = uStack_990;
    uStack_468 = uStack_988;
    local_4a0 = local_9c0;
    uStack_498 = uStack_9b8;
    uStack_490 = uStack_9b0;
    uStack_488 = uStack_9a8;
    auVar4 = vpaddw_avx2(auVar4,auVar5);
    local_9e0 = auVar6._0_8_;
    uStack_9d8 = auVar6._8_8_;
    uStack_9d0 = auVar6._16_8_;
    uStack_9c8 = auVar6._24_8_;
    local_4c0 = local_9c0;
    uStack_4b8 = uStack_9b8;
    uStack_4b0 = uStack_9b0;
    uStack_4a8 = uStack_9a8;
    local_4e0 = local_9e0;
    uStack_4d8 = uStack_9d8;
    uStack_4d0 = uStack_9d0;
    uStack_4c8 = uStack_9c8;
    auVar5 = vpaddw_avx2(auVar5,auVar6);
    local_900 = auVar4._0_8_;
    uStack_8f8 = auVar4._8_8_;
    auStack_8f0._0_8_ = auVar4._16_8_;
    auStack_8f0._8_8_ = auVar4._24_8_;
    local_500 = local_900;
    uStack_4f8 = uStack_8f8;
    uStack_4f0 = auStack_8f0._0_8_;
    uStack_4e8 = auStack_8f0._8_8_;
    local_520 = uVar8;
    uStack_518 = uVar9;
    uStack_510 = uVar10;
    uStack_508 = uVar11;
    auVar6._16_8_ = uVar10;
    auVar6._0_16_ = auVar3;
    auVar6._24_8_ = uVar11;
    auVar4 = vpaddw_avx2(auVar4,auVar6);
    local_900 = auVar4._0_8_;
    uStack_8f8 = auVar4._8_8_;
    auStack_8f0._0_8_ = auVar4._16_8_;
    auStack_8f0._8_8_ = auVar4._24_8_;
    local_920 = auVar5._0_8_;
    uStack_918 = auVar5._8_8_;
    uStack_910 = auVar5._16_8_;
    uStack_908 = auVar5._24_8_;
    local_540 = local_900;
    uStack_538 = uStack_8f8;
    uStack_530 = auStack_8f0._0_8_;
    uStack_528 = auStack_8f0._8_8_;
    local_560 = local_920;
    uStack_558 = uStack_918;
    uStack_550 = uStack_910;
    uStack_548 = uStack_908;
    auVar4 = vpaddw_avx2(auVar4,auVar5);
    local_900 = auVar4._0_8_;
    uStack_8f8 = auVar4._8_8_;
    auStack_8f0._0_8_ = auVar4._16_8_;
    auStack_8f0._8_8_ = auVar4._24_8_;
    local_360 = local_900;
    uStack_358 = uStack_8f8;
    uStack_350 = auStack_8f0._0_8_;
    uStack_348 = auStack_8f0._8_8_;
    local_364 = 2;
    auVar4 = vpsrlw_avx2(auVar4,ZEXT416(2));
    local_900 = auVar4._0_8_;
    uStack_8f8 = auVar4._8_8_;
    auStack_8f0._0_8_ = auVar4._16_8_;
    auStack_8f0._8_8_ = auVar4._24_8_;
    local_600 = local_900;
    uStack_5f8 = uStack_8f8;
    uStack_5f0 = auStack_8f0._0_8_;
    uStack_5e8 = auStack_8f0._8_8_;
    uStack_5a8 = auStack_8f0._8_8_;
    local_5b0 = auStack_8f0._0_8_;
    auStack_8f0 = auVar4._16_16_;
    auVar30 = vpackuswb_avx(auStack_8f0,local_5c0);
    local_9f0 = auVar30._0_8_;
    uStack_9e8 = auVar30._8_8_;
    local_170 = local_9f0;
    uStack_168 = uStack_9e8;
    local_180 = uVar17;
    uStack_178 = uVar18;
    auVar31 = vpshufb_avx(auVar30,auVar2);
    local_190 = local_9f0;
    uStack_188 = uStack_9e8;
    local_1a0 = uVar19;
    uStack_198 = uVar20;
    auVar30 = vpshufb_avx(auVar30,auVar1);
    local_570 = (undefined8 *)((long)auStack_818 + (long)local_82c + -8);
    local_a00 = auVar31._0_8_;
    uStack_9f8 = auVar31._8_8_;
    local_580 = local_a00;
    uStack_578 = uStack_9f8;
    *local_570 = local_a00;
    local_588 = (undefined8 *)((long)auStack_818 + local_82c + lVar16 + 0x818);
    local_a10 = auVar30._0_8_;
    uStack_a08 = auVar30._8_8_;
    local_5a0 = local_a10;
    uStack_598 = uStack_a08;
    *local_588 = local_a10;
    local_700 = local_700 + -1;
  }
  if (local_82c < local_ab4) {
    local_602 = 2;
    local_a2 = 2;
    local_a4 = 2;
    local_a6 = 2;
    local_a8 = 2;
    local_aa = 2;
    local_ac = 2;
    local_ae = 2;
    local_b0 = 2;
    auVar3 = vpinsrw_avx(ZEXT216(2),2,1);
    auVar3 = vpinsrw_avx(auVar3,2,2);
    auVar3 = vpinsrw_avx(auVar3,2,3);
    auVar3 = vpinsrw_avx(auVar3,2,4);
    auVar3 = vpinsrw_avx(auVar3,2,5);
    auVar3 = vpinsrw_avx(auVar3,2,6);
    auVar31 = vpinsrw_avx(auVar3,2,7);
    local_c0._0_8_ = auVar31._0_8_;
    local_c0._8_8_ = auVar31._8_8_;
    local_6a0._8_8_ = SUB168(ZEXT816(0),4);
    pauVar24 = (undefined1 (*) [16])(*local_700 + 1);
    uVar7 = *(undefined8 *)*pauVar24;
    uVar8 = *(undefined8 *)(*local_700 + 9);
    pauVar25 = (undefined1 (*) [16])(local_700[-1] + 0xf);
    uVar9 = *(undefined8 *)*pauVar25;
    uVar10 = *(undefined8 *)(*local_700 + 7);
    local_6f8 = local_700;
    uVar11 = *(undefined8 *)*local_700;
    uVar12 = *(undefined8 *)(*local_700 + 8);
    local_300 = 0;
    uStack_2f8 = local_6a0._8_8_;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_6a0._8_8_;
    auVar3 = vpunpckhbw_avx(*pauVar25,auVar3 << 0x40);
    local_320 = 0;
    uStack_318 = local_6a0._8_8_;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_6a0._8_8_;
    auVar30 = vpunpckhbw_avx(*local_700,auVar14 << 0x40);
    local_340 = 0;
    uStack_338 = local_6a0._8_8_;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_6a0._8_8_;
    auVar32 = vpunpckhbw_avx(*pauVar24,auVar15 << 0x40);
    local_a90 = auVar3._0_8_;
    uStack_a88 = auVar3._8_8_;
    local_aa0 = auVar30._0_8_;
    uStack_a98 = auVar30._8_8_;
    local_620 = local_a90;
    uStack_618 = uStack_a88;
    local_630 = local_aa0;
    uStack_628 = uStack_a98;
    auVar3 = vpaddw_avx(auVar3,auVar30);
    local_ab0 = auVar32._0_8_;
    uStack_aa8 = auVar32._8_8_;
    local_640 = local_aa0;
    uStack_638 = uStack_a98;
    local_650 = local_ab0;
    uStack_648 = uStack_aa8;
    auVar30 = vpaddw_avx(auVar30,auVar32);
    local_a40 = auVar3._0_8_;
    uStack_a38 = auVar3._8_8_;
    local_660 = local_a40;
    uStack_658 = uStack_a38;
    local_670 = local_c0._0_8_;
    uStack_668 = local_c0._8_8_;
    auVar3 = vpaddw_avx(auVar3,auVar31);
    local_a40 = auVar3._0_8_;
    uStack_a38 = auVar3._8_8_;
    local_a50 = auVar30._0_8_;
    uStack_a48 = auVar30._8_8_;
    local_680 = local_a40;
    uStack_678 = uStack_a38;
    local_690 = local_a50;
    uStack_688 = uStack_a48;
    auVar3 = vpaddw_avx(auVar3,auVar30);
    local_a40 = auVar3._0_8_;
    uStack_a38 = auVar3._8_8_;
    local_2d0 = local_a40;
    uStack_2c8 = uStack_a38;
    local_2d4 = 2;
    auVar3 = vpsrlw_avx(auVar3,ZEXT416(2));
    local_a40 = auVar3._0_8_;
    uStack_a38 = auVar3._8_8_;
    local_5d0 = local_a40;
    uStack_5c8 = uStack_a38;
    local_5e0 = local_a40;
    uStack_5d8 = uStack_a38;
    auVar3 = vpackuswb_avx(auVar3,auVar3);
    local_a50 = auVar3._0_8_;
    uStack_a48 = auVar3._8_8_;
    local_1b0 = local_a50;
    uStack_1a8 = uStack_a48;
    local_1c0 = uVar19;
    uStack_1b8 = uVar20;
    auVar1 = vpshufb_avx(auVar3,auVar1);
    local_1d0 = local_a50;
    uStack_1c8 = uStack_a48;
    local_1e0 = uVar17;
    uStack_1d8 = uVar18;
    auVar2 = vpshufb_avx(auVar3,auVar2);
    local_a50 = auVar2._0_8_;
    uStack_a48 = auVar2._8_8_;
    local_130 = local_a50;
    uStack_128 = uStack_a48;
    local_140 = local_a50;
    uVar18 = local_140;
    uStack_138 = uStack_a48;
    local_140._0_4_ = auVar2._0_4_;
    *(undefined4 *)((long)auStack_818 + (long)local_82c + -8) = (undefined4)local_140;
    local_a40 = auVar1._0_8_;
    uStack_a38 = auVar1._8_8_;
    local_150 = local_a40;
    uStack_148 = uStack_a38;
    local_160 = local_a40;
    uVar17 = local_160;
    uStack_158 = uStack_a38;
    local_160._0_4_ = auVar1._0_4_;
    *(undefined4 *)((long)auStack_818 + local_82c + lVar16 + 0x818) = (undefined4)local_160;
    local_6f0 = pauVar25;
    local_6e8 = pauVar24;
    local_6a0 = ZEXT816(0) << 0x20;
    local_330 = uVar7;
    uStack_328 = uVar8;
    local_310 = uVar11;
    uStack_308 = uVar12;
    local_2f0 = uVar9;
    uStack_2e8 = uVar10;
    local_160 = uVar17;
    local_140 = uVar18;
    local_c0 = auVar31;
  }
  if (local_ab4 < iVar22) {
    local_6a1 = *(byte *)((long)auStack_818 + (local_ab4 + -1) + lVar16 + 0x818);
    auVar2 = vpinsrb_avx(ZEXT116(local_6a1),(uint)local_6a1,1);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,2);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,3);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,4);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,5);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,6);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,7);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,8);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,9);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,10);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,0xb);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,0xc);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,0xd);
    auVar2 = vpinsrb_avx(auVar2,(uint)local_6a1,0xe);
    local_e0 = vpinsrb_avx(auVar2,(uint)local_6a1,0xf);
    uVar7 = local_e0._0_8_;
    uVar17 = local_e0._8_8_;
    local_d0 = local_6a1;
    local_cf = local_6a1;
    local_ce = local_6a1;
    local_cd = local_6a1;
    local_cc = local_6a1;
    local_cb = local_6a1;
    local_ca = local_6a1;
    local_c9 = local_6a1;
    local_c8 = local_6a1;
    local_c7 = local_6a1;
    local_c6 = local_6a1;
    local_c5 = local_6a1;
    local_c4 = local_6a1;
    local_c3 = local_6a1;
    local_c2 = local_6a1;
    local_c1 = local_6a1;
    for (local_82c = local_ab4; local_82c < iVar22; local_82c = local_82c + 1) {
      local_6b0 = (undefined8 *)((long)auStack_818 + (long)local_82c + -8);
      local_6c0 = uVar7;
      uStack_6b8 = uVar17;
      *local_6b0 = uVar7;
      *(undefined8 *)((long)auStack_818 + (long)local_82c) = uVar17;
      puVar26 = (undefined8 *)((long)auStack_818 + local_82c + lVar16 + 0x818);
      local_6e0 = uVar7;
      uStack_6d8 = uVar17;
      local_6c8 = puVar26;
      *puVar26 = uVar7;
      puVar26[1] = uVar17;
    }
  }
  local_718 = local_718 / 2;
  if (local_714 == 4) {
    for (local_82c = 0; local_82c < local_718; local_82c = local_82c + 1) {
      *(undefined4 *)local_708 = *(undefined4 *)((long)auStack_818 + (long)local_82c + -8);
      *(undefined4 *)((long)local_708 + (long)local_70c) =
           *(undefined4 *)((long)auStack_818 + local_82c + lVar16 + 0x818);
      local_708 = (undefined8 *)((long)local_708 + (long)iVar23);
    }
  }
  else if (local_714 == 8) {
    for (local_82c = 0; local_82c < local_718; local_82c = local_82c + 1) {
      *local_708 = *(undefined8 *)((long)auStack_818 + (long)local_82c + -8);
      *(undefined8 *)((long)local_708 + (long)local_70c) =
           *(undefined8 *)((long)auStack_818 + local_82c + lVar16 + 0x818);
      local_708 = (undefined8 *)((long)local_708 + (long)iVar23);
    }
  }
  else if (local_714 == 0x10) {
    for (local_82c = 0; local_82c < local_718; local_82c = local_82c + 1) {
      *local_708 = *(undefined8 *)((long)auStack_818 + (long)local_82c + -8);
      local_708[1] = *(undefined8 *)((long)auStack_818 + (long)local_82c);
      *(undefined8 *)((long)local_708 + (long)local_70c) =
           *(undefined8 *)((long)auStack_818 + local_82c + lVar16 + 0x818);
      *(undefined8 *)((long)local_708 + (long)local_70c + 8) =
           *(undefined8 *)((long)auStack_818 + local_82c + lVar27);
      local_708 = (undefined8 *)((long)local_708 + (long)iVar23);
    }
  }
  else if (local_714 == 0x20) {
    for (local_82c = 0; local_82c < local_718; local_82c = local_82c + 1) {
      lVar28 = (long)local_82c;
      *local_708 = *(undefined8 *)((long)auStack_818 + lVar28 + -8);
      local_708[1] = *(undefined8 *)((long)auStack_818 + lVar28);
      local_708[2] = *(undefined8 *)((long)auStack_818 + lVar28 + 8);
      local_708[3] = *(undefined8 *)((long)auStack_818 + lVar28 + 0x10);
      lVar28 = (long)local_70c;
      lVar29 = (long)local_82c;
      *(undefined8 *)((long)local_708 + lVar28) =
           *(undefined8 *)((long)auStack_818 + lVar29 + lVar16 + 0x818);
      *(undefined8 *)((long)local_708 + lVar28 + 8) =
           *(undefined8 *)((long)auStack_818 + lVar29 + lVar27);
      *(undefined8 *)((long)local_708 + lVar28 + 0x10) =
           *(undefined8 *)((long)auStack_818 + lVar29 + lVar27 + 8);
      *(undefined8 *)((long)local_708 + lVar28 + 0x18) =
           *(undefined8 *)((long)auStack_818 + lVar29 + lVar27 + 0x10);
      local_708 = (undefined8 *)((long)local_708 + (long)iVar23);
    }
  }
  else if (local_714 == 0x40) {
    for (local_82c = 0; local_82c < local_718; local_82c = local_82c + 1) {
      memcpy(local_708,(void *)((long)auStack_818 + (long)local_82c + -8),0x40);
      memcpy((void *)((long)local_708 + (long)local_70c),
             (void *)((long)auStack_818 + local_82c + lVar16 + 0x818),0x40);
      local_708 = (undefined8 *)((long)local_708 + (long)iVar23);
    }
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_y_32_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    ALIGNED_16(pel first_line[2 * (64 + 64)]);
    int line_size = height / 2 + width - 1;
    int real_size = COM_MIN(line_size, height);
    int i;
    __m128i pad_val;
    int aligned_line_size = ((line_size + 63) >> 4) << 4;
    pel *pfirst[2];
    __m256i coeff2 = _mm256_set1_epi16(2);
    __m256i zero = _mm256_setzero_si256();
    __m128i shuffle1 = _mm_setr_epi8(15, 13, 11, 9, 7, 5, 3, 1, 14, 12, 10, 8, 6, 4, 2, 0);
    __m128i shuffle2 = _mm_setr_epi8(14, 12, 10, 8, 6, 4, 2, 0, 15, 13, 11, 9, 7, 5, 3, 1);
    int i_dst2 = i_dst * 2;

    pfirst[0] = first_line;
    pfirst[1] = first_line + aligned_line_size;

    src -= 18;

    for (i = 0; i < real_size - 4; i += 8, src -= 16) {
        __m256i p0, p1;
        __m256i S0 = _mm256_set_epi64x(0, *(s64 *)(src + 7), 0, *(s64 *)(src - 1));
        __m256i S1 = _mm256_set_epi64x(0, *(s64 *)(src + 8), 0, *(s64 *)(src));
        __m256i S2 = _mm256_set_epi64x(0, *(s64 *)(src + 9), 0, *(s64 *)(src + 1));

        __m256i L0 = _mm256_unpacklo_epi8(S0, zero);
        __m256i L1 = _mm256_unpacklo_epi8(S1, zero);
        __m256i L2 = _mm256_unpacklo_epi8(S2, zero);
        __m128i m0, d0, d1;

        p0 = _mm256_add_epi16(L0, L1);
        p1 = _mm256_add_epi16(L1, L2);
        p0 = _mm256_add_epi16(p0, coeff2);
        p0 = _mm256_add_epi16(p0, p1);
        p0 = _mm256_srli_epi16(p0, 2);

        m0 = _mm_packus_epi16(_mm256_castsi256_si128(p0), _mm256_extracti128_si256(p0, 1));
        d0 = _mm_shuffle_epi8(m0, shuffle1);
        d1 = _mm_shuffle_epi8(m0, shuffle2);
        _mm_storel_epi64((__m128i *)&pfirst[0][i], d0);
        _mm_storel_epi64((__m128i *)&pfirst[1][i], d1);
    }

    if (i < real_size) {
        __m128i coeff2 = _mm_set1_epi16(2);
        __m128i zero = _mm_setzero_si128();
        __m128i p10, p11;
        __m128i S2 = _mm_loadu_si128((__m128i *)(src + 1));
        __m128i S0 = _mm_loadu_si128((__m128i *)(src - 1));
        __m128i S1 = _mm_loadu_si128((__m128i *)(src));

        __m128i H0 = _mm_unpackhi_epi8(S0, zero);
        __m128i H1 = _mm_unpackhi_epi8(S1, zero);
        __m128i H2 = _mm_unpackhi_epi8(S2, zero);

        p10 = _mm_add_epi16(H0, H1);
        p11 = _mm_add_epi16(H1, H2);
        p10 = _mm_add_epi16(p10, coeff2);
        p10 = _mm_add_epi16(p10, p11);
        p10 = _mm_srli_epi16(p10, 2);

        p11 = _mm_packus_epi16(p10, p10);
        p10 = _mm_shuffle_epi8(p11, shuffle2);
        p11 = _mm_shuffle_epi8(p11, shuffle1);
        ((int *)&pfirst[0][i])[0] = _mm_cvtsi128_si32(p11);
        ((int *)&pfirst[1][i])[0] = _mm_cvtsi128_si32(p10);
    }

    // padding
    if (real_size < line_size) {
        pad_val = _mm_set1_epi8((char)pfirst[1][real_size - 1]);
        for (i = real_size; i < line_size; i++) {
            _mm_storeu_si128((__m128i *)&pfirst[0][i], pad_val);
            _mm_storeu_si128((__m128i *)&pfirst[1][i], pad_val);
        }
    }

    height /= 2;

#define COPY_Y32(w) { \
    for (i = 0; i < height; i++) { \
        memcpy(dst, pfirst[0] + i, w * sizeof(pel)); \
        memcpy(dst + i_dst, pfirst[1] + i, w * sizeof(pel)); \
        dst += i_dst2;\
    } \
}
    switch (width) {
    case 4:
        COPY_Y32(4)
            break;
    case 8:
        COPY_Y32(8)
            break;
    case 16:
        COPY_Y32(16)
            break;
    case 32:
        COPY_Y32(32)
            break;
    case 64:
        COPY_Y32(64)
            break;
    }
}